

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::MergePartialFromCodedStream
          (ImageFeatureType_ImageSize *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  uint64 *puVar6;
  ulong uVar7;
  pair<unsigned_long,_bool> pVar8;
  
LAB_001397ba:
  do {
    pbVar4 = input->buffer_;
    uVar2 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar5 = *pbVar4;
      uVar2 = (uint32)bVar5;
      if ((char)bVar5 < '\x01') goto LAB_001397dd;
      input->buffer_ = pbVar4 + 1;
      uVar7 = (ulong)bVar5 | 0x100000000;
    }
    else {
LAB_001397dd:
      uVar2 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar2);
      uVar7 = 0;
      if (uVar2 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar2 | uVar7;
    }
    uVar2 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_0013985b:
      if (uVar2 == 0) {
        return true;
      }
      if ((uVar2 & 7) == 4) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar2);
      if (!bVar1) {
        return false;
      }
      goto LAB_001397ba;
    }
    uVar3 = (uint)(uVar7 >> 3) & 0x1fffffff;
    if (uVar3 == 2) {
      if ((char)uVar7 != '\x10') goto LAB_0013985b;
      pbVar4 = input->buffer_;
      if ((input->buffer_end_ <= pbVar4) ||
         (bVar5 = *pbVar4, puVar6 = &this->height_, (char)bVar5 < '\0')) {
        pVar8 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->height_ = pVar8.first;
        goto LAB_00139889;
      }
LAB_0013984a:
      *puVar6 = (ulong)bVar5;
      input->buffer_ = pbVar4 + 1;
    }
    else {
      if ((uVar3 != 1) || ((char)uVar7 != '\b')) goto LAB_0013985b;
      pbVar4 = input->buffer_;
      if ((pbVar4 < input->buffer_end_) &&
         (bVar5 = *pbVar4, puVar6 = &this->width_, -1 < (char)bVar5)) goto LAB_0013984a;
      pVar8 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->width_ = pVar8.first;
LAB_00139889:
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
  } while( true );
}

Assistant:

bool ImageFeatureType_ImageSize::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ImageFeatureType.ImageSize)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 width = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 height = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ImageFeatureType.ImageSize)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ImageFeatureType.ImageSize)
  return false;
#undef DO_
}